

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

Bool ParseCharEnc(TidyDocImpl *doc,TidyOptionImpl *option)

{
  StreamIn *in;
  uint uVar1;
  Bool BVar2;
  uint encoding;
  ulong uVar3;
  ulong uVar4;
  tmbchar buf [64];
  tmbchar local_68 [72];
  
  local_68[0x30] = '\0';
  local_68[0x31] = '\0';
  local_68[0x32] = '\0';
  local_68[0x33] = '\0';
  local_68[0x34] = '\0';
  local_68[0x35] = '\0';
  local_68[0x36] = '\0';
  local_68[0x37] = '\0';
  local_68[0x38] = '\0';
  local_68[0x39] = '\0';
  local_68[0x3a] = '\0';
  local_68[0x3b] = '\0';
  local_68[0x3c] = '\0';
  local_68[0x3d] = '\0';
  local_68[0x3e] = '\0';
  local_68[0x3f] = '\0';
  local_68[0x20] = '\0';
  local_68[0x21] = '\0';
  local_68[0x22] = '\0';
  local_68[0x23] = '\0';
  local_68[0x24] = '\0';
  local_68[0x25] = '\0';
  local_68[0x26] = '\0';
  local_68[0x27] = '\0';
  local_68[0x28] = '\0';
  local_68[0x29] = '\0';
  local_68[0x2a] = '\0';
  local_68[0x2b] = '\0';
  local_68[0x2c] = '\0';
  local_68[0x2d] = '\0';
  local_68[0x2e] = '\0';
  local_68[0x2f] = '\0';
  local_68[0x10] = '\0';
  local_68[0x11] = '\0';
  local_68[0x12] = '\0';
  local_68[0x13] = '\0';
  local_68[0x14] = '\0';
  local_68[0x15] = '\0';
  local_68[0x16] = '\0';
  local_68[0x17] = '\0';
  local_68[0x18] = '\0';
  local_68[0x19] = '\0';
  local_68[0x1a] = '\0';
  local_68[0x1b] = '\0';
  local_68[0x1c] = '\0';
  local_68[0x1d] = '\0';
  local_68[0x1e] = '\0';
  local_68[0x1f] = '\0';
  local_68[0] = '\0';
  local_68[1] = '\0';
  local_68[2] = '\0';
  local_68[3] = '\0';
  local_68[4] = '\0';
  local_68[5] = '\0';
  local_68[6] = '\0';
  local_68[7] = '\0';
  local_68[8] = '\0';
  local_68[9] = '\0';
  local_68[10] = '\0';
  local_68[0xb] = '\0';
  local_68[0xc] = '\0';
  local_68[0xd] = '\0';
  local_68[0xe] = '\0';
  local_68[0xf] = '\0';
  uVar1 = SkipWhite(&doc->config);
  if (uVar1 == 0xffffffff) {
    uVar3 = 0;
  }
  else {
    uVar4 = 0;
    while (BVar2 = prvTidyIsWhite(uVar1), uVar3 = uVar4, BVar2 == no) {
      uVar1 = prvTidyToLower(uVar1);
      local_68[uVar4] = (tmbchar)uVar1;
      if ((doc->config).c != 0xffffffff) {
        in = (doc->config).cfgIn;
        if (in == (StreamIn *)0x0) {
          uVar1 = 0xffffffff;
        }
        else {
          uVar1 = prvTidyReadChar(in);
        }
        (doc->config).c = uVar1;
      }
      uVar3 = uVar4 + 1;
      if ((0x3c < uVar4) || (uVar1 = (doc->config).c, uVar4 = uVar3, uVar1 == 0xffffffff)) break;
    }
  }
  local_68[uVar3] = '\0';
  encoding = prvTidyGetCharEncodingFromOptName(local_68);
  if ((int)encoding < 0) {
    prvTidyReportBadArgument(doc,option->name);
  }
  else {
    prvTidySetOptionInt(doc,option->id,(ulong)encoding);
  }
  if ((-1 < (int)encoding) && (option->id == TidyCharEncoding)) {
    prvTidyAdjustCharEncoding(doc,encoding);
  }
  return (uint)((int)encoding >= 0);
}

Assistant:

Bool ParseCharEnc( TidyDocImpl* doc, const TidyOptionImpl* option )
{
    tmbchar buf[64] = {0};
    uint i = 0;
    int enc = ASCII;
    Bool validEncoding = yes;
    tchar c = SkipWhite( &doc->config );

    while ( i < sizeof(buf)-2 && c != EndOfStream && !TY_(IsWhite)(c) )
    {
        buf[i++] = (tmbchar) TY_(ToLower)( c );
        c = AdvanceChar( &doc->config );
    }
    buf[i] = 0;

    enc = TY_(CharEncodingId)( doc, buf );

    if ( enc < 0 )
    {
        validEncoding = no;
        TY_(ReportBadArgument)( doc, option->name );
    }
    else
        TY_(SetOptionInt)( doc, option->id, enc );

    if ( validEncoding && option->id == TidyCharEncoding )
        TY_(AdjustCharEncoding)( doc, enc );
    return validEncoding;
}